

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.c
# Opt level: O0

wchar_t project_path(chunk *c,loc_conflict *gp,wchar_t range,loc_conflict grid1,loc_conflict grid2,
                    wchar_t flg)

{
  _Bool _Var1;
  wchar_t wVar2;
  int iVar3;
  loc grid2_00;
  loc_conflict lVar4;
  loc lVar5;
  square_conflict *psVar6;
  wchar_t wVar7;
  loc_conflict decoy;
  wchar_t m;
  wchar_t half;
  wchar_t full;
  wchar_t frac;
  wchar_t sx;
  wchar_t sy;
  wchar_t ax;
  wchar_t ay;
  wchar_t k;
  wchar_t n;
  wchar_t x;
  wchar_t y;
  wchar_t flg_local;
  wchar_t range_local;
  loc_conflict *gp_local;
  chunk *c_local;
  wchar_t wStack_18;
  loc_conflict grid2_local;
  loc_conflict grid1_local;
  
  ay = L'\0';
  ax = L'\0';
  grid2_00 = cave_find_decoy((chunk_conflict *)c);
  _Var1 = loc_eq((loc)grid1,(loc)grid2);
  if (_Var1) {
    grid1_local.x = L'\0';
  }
  else {
    wStack_18 = grid2.y;
    grid2_local.y = grid1.y;
    if (wStack_18 < grid2_local.y) {
      sy = grid2_local.y - wStack_18;
      frac = L'\xffffffff';
    }
    else {
      sy = wStack_18 - grid2_local.y;
      frac = L'\x01';
    }
    c_local._4_4_ = grid2.x;
    grid2_local.x = grid1.x;
    if (c_local._4_4_ < grid2_local.x) {
      sx = grid2_local.x - c_local._4_4_;
      full = L'\xffffffff';
    }
    else {
      sx = c_local._4_4_ - grid2_local.x;
      full = L'\x01';
    }
    wVar2 = sy * sx;
    if (sx < sy) {
      half = sx * sx;
      iVar3 = half * 2;
      k = grid2_local.x;
      while( true ) {
        n = grid2_local.y + frac;
        wVar7 = ay + L'\x01';
        lVar4 = (loc_conflict)loc(k,n);
        gp[ay] = lVar4;
        ay = wVar7;
        if (range <= wVar7 + (ax >> 1)) break;
        if ((flg & 4U) == 0) {
          lVar5 = loc(k,n);
          _Var1 = loc_eq(lVar5,(loc)grid2);
          if (_Var1) break;
        }
        if ((flg & 0x8000U) == 0) {
          if ((flg & 0x1000U) == 0) {
            if (L'\0' < wVar7) {
              lVar4 = (loc_conflict)loc(k,n);
              _Var1 = square_isprojectable(c,lVar4);
              if (!_Var1) break;
            }
          }
          else if (L'\0' < wVar7) {
            lVar4 = (loc_conflict)loc(k,n);
            _Var1 = square_isbelievedwall(c,lVar4);
            if (_Var1) break;
          }
        }
        if ((flg & 8U) != 0) {
          if (L'\0' < wVar7) {
            lVar4 = (loc_conflict)loc(k,n);
            psVar6 = square(c,lVar4);
            if (psVar6->mon != 0) break;
          }
          lVar5 = loc(k,n);
          _Var1 = loc_eq(lVar5,grid2_00);
          if (_Var1) break;
        }
        grid2_local.y = n;
        if ((iVar3 != 0) && (half = iVar3 + half, wVar2 <= half)) {
          k = full + k;
          half = half + wVar2 * -2;
          ax = ax + L'\x01';
        }
      }
    }
    else if (sy < sx) {
      half = sy * sy;
      iVar3 = half * 2;
      n = grid2_local.y;
      while( true ) {
        k = grid2_local.x + full;
        wVar7 = ay + L'\x01';
        lVar4 = (loc_conflict)loc(k,n);
        gp[ay] = lVar4;
        ay = wVar7;
        if (range <= wVar7 + (ax >> 1)) break;
        if ((flg & 4U) == 0) {
          lVar5 = loc(k,n);
          _Var1 = loc_eq(lVar5,(loc)grid2);
          if (_Var1) break;
        }
        if ((flg & 0x8000U) == 0) {
          if ((flg & 0x1000U) == 0) {
            if (L'\0' < wVar7) {
              lVar4 = (loc_conflict)loc(k,n);
              _Var1 = square_isprojectable(c,lVar4);
              if (!_Var1) break;
            }
          }
          else if (L'\0' < wVar7) {
            lVar4 = (loc_conflict)loc(k,n);
            _Var1 = square_isbelievedwall(c,lVar4);
            if (_Var1) break;
          }
        }
        if ((flg & 8U) != 0) {
          if (L'\0' < wVar7) {
            lVar4 = (loc_conflict)loc(k,n);
            psVar6 = square(c,lVar4);
            if (psVar6->mon != 0) break;
          }
          lVar5 = loc(k,n);
          _Var1 = loc_eq(lVar5,grid2_00);
          if (_Var1) break;
        }
        grid2_local.x = k;
        if ((iVar3 != 0) && (half = iVar3 + half, wVar2 <= half)) {
          n = frac + n;
          half = half + wVar2 * -2;
          ax = ax + L'\x01';
        }
      }
    }
    else {
      do {
        do {
          n = grid2_local.y + frac;
          k = grid2_local.x + full;
          wVar2 = ay + L'\x01';
          lVar4 = (loc_conflict)loc(k,n);
          gp[ay] = lVar4;
          ay = wVar2;
          if (range <= wVar2 + (wVar2 >> 1)) goto LAB_002189ee;
          if ((flg & 4U) == 0) {
            lVar5 = loc(k,n);
            _Var1 = loc_eq(lVar5,(loc)grid2);
            if (_Var1) goto LAB_002189ee;
          }
          if ((flg & 0x8000U) == 0) {
            if ((flg & 0x1000U) == 0) {
              if (L'\0' < wVar2) {
                lVar4 = (loc_conflict)loc(k,n);
                _Var1 = square_isprojectable(c,lVar4);
                if (!_Var1) goto LAB_002189ee;
              }
            }
            else if (L'\0' < wVar2) {
              lVar4 = (loc_conflict)loc(k,n);
              _Var1 = square_isbelievedwall(c,lVar4);
              if (_Var1) goto LAB_002189ee;
            }
          }
          grid2_local.x = k;
          grid2_local.y = n;
        } while ((flg & 8U) == 0);
        if (L'\0' < wVar2) {
          lVar4 = (loc_conflict)loc(k,n);
          psVar6 = square(c,lVar4);
          if (psVar6->mon != 0) break;
        }
        lVar5 = loc(k,n);
        _Var1 = loc_eq(lVar5,grid2_00);
      } while (!_Var1);
    }
LAB_002189ee:
    grid1_local.x = ay;
  }
  return grid1_local.x;
}

Assistant:

int project_path(struct chunk *c, struct loc *gp, int range, struct loc grid1,
				 struct loc grid2, int flg)
{
	int y, x;

	int n = 0;
	int k = 0;

	/* Absolute */
	int ay, ax;

	/* Offsets */
	int sy, sx;

	/* Fractions */
	int frac;

	/* Scale factors */
	int full, half;

	/* Slope */
	int m;

	/* Possible decoy */
	struct loc decoy = cave_find_decoy(c);

	/* No path necessary (or allowed) */
	if (loc_eq(grid1, grid2)) return (0);


	/* Analyze "dy" */
	if (grid2.y < grid1.y) {
		ay = (grid1.y - grid2.y);
		sy = -1;
	} else {
		ay = (grid2.y - grid1.y);
		sy = 1;
	}

	/* Analyze "dx" */
	if (grid2.x < grid1.x) {
		ax = (grid1.x - grid2.x);
		sx = -1;
	} else {
		ax = (grid2.x - grid1.x);
		sx = 1;
	}


	/* Number of "units" in one "half" grid */
	half = (ay * ax);

	/* Number of "units" in one "full" grid */
	full = half << 1;


	/* Vertical */
	if (ay > ax) {
		/* Start at tile edge */
		frac = ax * ax;

		/* Let m = ((dx/dy) * full) = (dx * dx * 2) = (frac * 2) */
		m = frac << 1;

		/* Start */
		y = grid1.y + sy;
		x = grid1.x;

		/* Create the projection path */
		while (1) {
			/* Save grid */
			gp[n++] = loc(x, y);

			/* Hack -- Check maximum range */
			if ((n + (k >> 1)) >= range) break;

			/* Sometimes stop at finish grid */
			if (!(flg & (PROJECT_THRU)))
				if (loc_eq(loc(x, y), grid2)) break;

			/* Don't stop if making paths through rock for generation */
			if (!(flg & (PROJECT_ROCK))) {
				/* Stop at non-initial wall grids, except where that would
				 * leak info during targetting */
				if (!(flg & (PROJECT_INFO))) {
					if ((n > 0) && !square_isprojectable(c, loc(x, y))) {
						break;
					}
				} else if ((n > 0) && square_isbelievedwall(c, loc(x, y))) {
					break;
				}
			}

			/* Sometimes stop at non-initial monsters/players, decoys */
			if (flg & (PROJECT_STOP)) {
				if ((n > 0) && (square(c, loc(x, y))->mon != 0)) break;
				if (loc_eq(loc(x, y), decoy)) break;
			}

			/* Slant */
			if (m) {
				/* Advance (X) part 1 */
				frac += m;

				/* Horizontal change */
				if (frac >= half) {
					/* Advance (X) part 2 */
					x += sx;

					/* Advance (X) part 3 */
					frac -= full;

					/* Track distance */
					k++;
				}
			}

			/* Advance (Y) */
			y += sy;
		}
	}

	/* Horizontal */
	else if (ax > ay) {
		/* Start at tile edge */
		frac = ay * ay;

		/* Let m = ((dy/dx) * full) = (dy * dy * 2) = (frac * 2) */
		m = frac << 1;

		/* Start */
		y = grid1.y;
		x = grid1.x + sx;

		/* Create the projection path */
		while (1) {
			/* Save grid */
			gp[n++] = loc(x, y);

			/* Hack -- Check maximum range */
			if ((n + (k >> 1)) >= range) break;

			/* Sometimes stop at finish grid */
			if (!(flg & (PROJECT_THRU)))
				if (loc_eq(loc(x, y), grid2)) break;

			/* Don't stop if making paths through rock for generation */
			if (!(flg & (PROJECT_ROCK))) {
				/* Stop at non-initial wall grids, except where that would
				 * leak info during targetting */
				if (!(flg & (PROJECT_INFO))) {
					if ((n > 0) && !square_isprojectable(c, loc(x, y))) {
						break;
					}
				} else if ((n > 0) && square_isbelievedwall(c, loc(x, y))) {
					break;
				}
			}

			/* Sometimes stop at non-initial monsters/players, decoys */
			if (flg & (PROJECT_STOP)) {
				if ((n > 0) && (square(c, loc(x, y))->mon != 0)) break;
				if (loc_eq(loc(x, y), decoy)) break;
			}

			/* Slant */
			if (m) {
				/* Advance (Y) part 1 */
				frac += m;

				/* Vertical change */
				if (frac >= half) {
					/* Advance (Y) part 2 */
					y += sy;

					/* Advance (Y) part 3 */
					frac -= full;

					/* Track distance */
					k++;
				}
			}

			/* Advance (X) */
			x += sx;
		}
	}

	/* Diagonal */
	else {
		/* Start */
		y = grid1.y + sy;
		x = grid1.x + sx;

		/* Create the projection path */
		while (1) {
			/* Save grid */
			gp[n++] = loc(x, y);

			/* Hack -- Check maximum range */
			if ((n + (n >> 1)) >= range) break;

			/* Sometimes stop at finish grid */
			if (!(flg & (PROJECT_THRU)))
				if (loc_eq(loc(x, y), grid2)) break;

			/* Don't stop if making paths through rock for generation */
			if (!(flg & (PROJECT_ROCK))) {
				/* Stop at non-initial wall grids, except where that would
				 * leak info during targetting */
				if (!(flg & (PROJECT_INFO))) {
					if ((n > 0) && !square_isprojectable(c, loc(x, y))) {
						break;
					}
				} else if ((n > 0) && square_isbelievedwall(c, loc(x, y))) {
					break;
				}
			}

			/* Sometimes stop at non-initial monsters/players, decoys */
			if (flg & (PROJECT_STOP)) {
				if ((n > 0) && (square(c, loc(x, y))->mon != 0)) break;
				if (loc_eq(loc(x, y), decoy)) break;
			}

			/* Advance */
			y += sy;
			x += sx;
		}
	}

	/* Length */
	return (n);
}